

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb99.c
# Opt level: O3

err_t stb99ParamsGen(stb99_params *params,stb99_seed *seed)

{
  octet *buf;
  word *b;
  word *p;
  word *r;
  qr_o *r_00;
  u64 *puVar1;
  size_t sVar2;
  err_t eVar3;
  bool_t bVar4;
  size_t *psVar5;
  ulong uVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  size_t sVar14;
  blob_t state;
  size_t sVar15;
  word *a;
  ulong uVar16;
  long lVar17;
  void *stack;
  ulong n;
  long lVar18;
  ulong uVar19;
  ulong no;
  ulong local_98;
  
  eVar3 = stb99SeedVal(seed);
  if (eVar3 == 0) {
    bVar4 = memIsValid(params,0x3d0);
    if (bVar4 == 0) {
      eVar3 = 0x6d;
    }
    else {
      lVar17 = 0;
      memSet(params,'\0',0x3d0);
      sVar15 = seed->l;
      params->l = sVar15;
      psVar5 = _ls;
      do {
        if (*psVar5 == sVar15) goto LAB_00142794;
        lVar17 = lVar17 + 1;
        psVar5 = psVar5 + 1;
      } while (lVar17 != 10);
      lVar17 = 10;
LAB_00142794:
      sVar2 = _rs[lVar17];
      params->r = sVar2;
      uVar6 = seed->ri[1];
      uVar19 = seed->ri[0] + 0x3f >> 6;
      if (0x20 < uVar6) {
        psVar5 = seed->ri + 2;
        do {
          uVar19 = uVar19 + (uVar6 + 0x3f >> 6);
          uVar6 = *psVar5;
          psVar5 = psVar5 + 1;
        } while (0x20 < uVar6);
      }
      uVar6 = seed->di[1];
      local_98 = seed->di[0] + 0x3f >> 6;
      lVar17 = 1;
      if (0x20 < uVar6) {
        lVar18 = 0xb;
        do {
          lVar17 = lVar18;
          local_98 = local_98 + (uVar6 + 0x3f >> 6);
          uVar6 = *(ulong *)(seed->zi + lVar17 * 4 + -4);
          lVar18 = lVar17 + 1;
        } while (0x20 < uVar6);
        lVar17 = lVar17 + -9;
      }
      n = sVar15 + 0x3f >> 6;
      no = sVar15 + 7 >> 3;
      uVar6 = sVar2 + 0x3f >> 6;
      sVar7 = prngSTB_keep();
      sVar15 = seed->di[0];
      sVar8 = zmMontCreate_keep(no);
      sVar9 = priNextPrimeW_deep();
      sVar10 = priExtendPrime_deep(params->l,seed->di[1] + 0x3f >> 6,seed->di[0] + 3 >> 2);
      sVar11 = priExtendPrime2_deep
                         (params->l,seed->di[0] + 0x3f >> 6,seed->ri[0] + 0x3f >> 6,
                          params->l + 3 >> 2);
      sVar12 = zmMontCreate_deep(no);
      sVar13 = zzDiv_deep(n,uVar6);
      sVar14 = zmMontCreate_deep(no);
      sVar14 = qrPower_deep(n,n,sVar14);
      sVar9 = utilMax(6,sVar9,sVar10,sVar11,sVar12,sVar13,sVar14);
      state = blobCreate(sVar8 + sVar7 + n * 0x10 + local_98 * 8 + 8 + (sVar15 + 0x3f >> 6) * 8 +
                         sVar9);
      if (state != (blob_t)0x0) {
        sVar15 = prngSTB_keep();
        a = (word *)(sVar15 + (long)state);
        b = a + local_98 + 1;
        p = b + (seed->di[0] + 0x3f >> 6);
        r = p + n;
        r_00 = (qr_o *)(r + n);
        sVar15 = zmMontCreate_keep(no);
        stack = (void *)((long)&(r_00->hdr).keep + sVar15);
        prngSTBStart(state,seed->zi);
        do {
          while( true ) {
            uVar16 = seed->di[lVar17];
            puVar1 = a + local_98;
            if (uVar16 < 0x21) break;
            sVar7 = uVar16 + 3 >> 2;
            sVar15 = priBaseSize();
            if (sVar15 < sVar7) {
              sVar7 = priBaseSize();
            }
            bVar4 = priExtendPrime(puVar1,seed->di[lVar17],puVar1 + (seed->di[lVar17] + 0x3f >> 6),
                                   seed->di[lVar17 + 1] + 0x3f >> 6,uVar16 << 2,sVar7,prngSTBStepR,
                                   state,stack);
            if (bVar4 != 0) goto LAB_00142b08;
            psVar5 = seed->di + lVar17;
            lVar17 = lVar17 + 1;
            local_98 = local_98 + (*psVar5 + 0x3f >> 6);
          }
          do {
            prngSTBStepR(puVar1,seed->di[lVar17] + 7 >> 3,state);
            u64From(puVar1,puVar1,seed->di[lVar17] + 7 >> 3);
            wwTrimHi(puVar1,1,seed->di[lVar17] - 1);
            wwSetBit(puVar1,seed->di[lVar17] - 1,1);
            bVar4 = priNextPrimeW(puVar1,*puVar1,stack);
          } while (bVar4 == 0);
LAB_00142b08:
          if (lVar17 == 0) {
            wwCopy(b,a,seed->di[0] + 0x3f >> 6);
            lVar17 = 1;
            do {
              do {
                lVar18 = lVar17;
                sVar15 = seed->ri[lVar18];
                lVar17 = lVar18 + 1;
                uVar16 = uVar19;
              } while (0x20 < sVar15);
LAB_00142b83:
              while (puVar1 = a + uVar16, 0x20 < sVar15) {
                sVar8 = sVar15 + 3 >> 2;
                sVar7 = priBaseSize();
                if (sVar7 < sVar8) {
                  sVar8 = priBaseSize();
                }
                bVar4 = priExtendPrime(puVar1,seed->ri[lVar18],
                                       puVar1 + (seed->ri[lVar18] + 0x3f >> 6),
                                       seed->ri[lVar18 + 1] + 0x3f >> 6,sVar15 << 2,sVar8,
                                       prngSTBStepR,state,stack);
                if (bVar4 != 0) goto LAB_00142c7f;
                psVar5 = seed->ri + lVar18;
                lVar17 = lVar18 + 1;
                lVar18 = lVar18 + 1;
                uVar16 = uVar16 + (*psVar5 + 0x3f >> 6);
                sVar15 = seed->ri[lVar17];
              }
              do {
                prngSTBStepR(puVar1,seed->ri[lVar18] + 7 >> 3,state);
                u64From(puVar1,puVar1,seed->ri[lVar18] + 7 >> 3);
                wwTrimHi(puVar1,1,seed->ri[lVar18] - 1);
                wwSetBit(puVar1,seed->ri[lVar18] - 1,1);
                bVar4 = priNextPrimeW(puVar1,*puVar1,stack);
              } while (bVar4 == 0);
LAB_00142c7f:
              if (lVar18 != 0) {
                sVar15 = seed->ri[lVar18 + -1];
                lVar18 = lVar18 + -1;
                uVar16 = uVar16 - (sVar15 + 0x3f >> 6);
                goto LAB_00142b83;
              }
              sVar15 = seed->di[0];
              sVar8 = sVar15 + 3 >> 2;
              sVar7 = priBaseSize();
              if (sVar7 < sVar8) {
                sVar8 = priBaseSize();
              }
              bVar4 = priExtendPrime2(p,params->l,b,seed->di[0] + 0x3f >> 6,a,
                                      seed->ri[0] + 0x3f >> 6,sVar15 << 2,sVar8,prngSTBStepR,state,
                                      stack);
              lVar17 = 1;
              if (bVar4 != 0) {
                u64To(params->p,no,p);
                u64To(params->q,sVar2 + 7 >> 3,a);
                zmMontCreate(r_00,params->p,no,params->l + 2,stack);
                zzSubW2(p,n,1);
                zzDiv(p,r,p,n,a,uVar6,stack);
                buf = params->d;
                memSet(buf,'\0',no);
                params->d[0] = '\x05';
                (*(code *)r[n + 8])(a,buf,r_00,stack);
                while( true ) {
                  qrPower(r,a,p,(n - uVar6) + 1,r_00,stack);
                  bVar4 = wwEq(r,(word *)r[n + 4],r[n + 6]);
                  if (bVar4 == 0) break;
                  zzAddWMod(a,a,1,(word *)r[n + 3],n);
                }
                u64To(params->a,no,r);
                u64To(buf,no,a);
                blobClose(state);
                return 0;
              }
            } while( true );
          }
          lVar18 = lVar17 + -1;
          lVar17 = lVar17 + -1;
          local_98 = local_98 - (seed->di[lVar18] + 0x3f >> 6);
        } while( true );
      }
      eVar3 = 0x6e;
    }
  }
  return eVar3;
}

Assistant:

err_t stb99ParamsGen(stb99_params* params, const stb99_seed* seed)
{
	err_t code;
	size_t i;
	size_t n, no;
	size_t m, mo;
	size_t gw;			/* число слов для хранения gi */
	size_t fw;			/* число слов для хранения fi */
	size_t offset;
	size_t trials;
	size_t base_count;
	// состояние 
	void* state;
	octet* stb_state;
	word* gi;			/* промежуточные простые при построении g0 */
	word* fi;			/* промежуточные простые при построении q */
	word* g0;
	word* p;
	word* d;
	word* a;
	qr_o* qr;
	void* stack;
	// проверить seed
	code = stb99SeedVal(seed);
	ERR_CALL_CHECK(code);
	// подготовить params
	if (!memIsValid(params, sizeof(stb99_params)))
		return ERR_BAD_INPUT;
	memSetZero(params, sizeof(stb99_params));
	params->l = seed->l;
	for (i = 0; i < COUNT_OF(_ls); ++i)
		if (_ls[i] == params->l)
			break;
	ASSERT(i != COUNT_OF(_ls));
	params->r = _rs[i];
	// определить fw
	for (i = 1, fw = W_OF_B(seed->ri[0]); seed->ri[i] > 32; ++i)
		fw += W_OF_B(seed->ri[i]);
	ASSERT(seed->ri[i] > 16);
	ASSERT(W_OF_B(seed->ri[i]) == 1);
	fw += 1;
	// определить gw
	for (i = 1, gw = W_OF_B(seed->di[0]); seed->di[i] > 32; ++i)
		gw += W_OF_B(seed->di[i]);
	ASSERT(seed->di[i] > 16);
	ASSERT(W_OF_B(seed->di[i]) == 1);
	gw += 1;
	ASSERT(gw > fw);
	// размерности
	n = W_OF_B(params->l), no = O_OF_B(params->l);
	m = W_OF_B(params->r), mo = O_OF_B(params->r);
	ASSERT(n <= gw);
	// создать состояние
	state = blobCreate(
		prngSTB_keep() + O_OF_W(gw) +
		O_OF_W(W_OF_B(seed->di[0]) + 2 * n) + zmMontCreate_keep(no) +
		utilMax(6,
			priNextPrimeW_deep(),
			priExtendPrime_deep(params->l, W_OF_B(seed->di[1]),
				(seed->di[0] + 3) / 4),
			priExtendPrime2_deep(params->l, W_OF_B(seed->di[0]),
				W_OF_B(seed->ri[0]), (params->l + 3) / 4),
			zmMontCreate_deep(no),
			zzDiv_deep(n, m),
			qrPower_deep(n, n, zmMontCreate_deep(no))));
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// раскладка состояния
	stb_state = (octet*)state;
	fi = gi = d = (word*)(stb_state + prngSTB_keep());
	g0 = gi + gw;
	p = g0 + W_OF_B(seed->di[0]);
	a = p + n;
	qr = (qr_o*)(a + n);
	stack = (octet*)qr + zmMontCreate_keep(no);
	// запустить генератор
	prngSTBStart(stb_state, seed->zi);
	// построить цепочку gi
	offset = gw - 1;
	while (1)
	{
		// первое (минимальное) gi?
		if (seed->di[i] <= 32)
		{
			ASSERT(offset == gw - 1);
			do
			{
				prngSTBStepR(gi + offset, O_OF_B(seed->di[i]), stb_state);
				wwFrom(gi + offset, gi + offset, O_OF_B(seed->di[i]));
				wwTrimHi(gi + offset, 1, seed->di[i] - 1);
				wwSetBit(gi + offset, seed->di[i] - 1, 1);
			}
			while (!priNextPrimeW(gi + offset, gi[offset], stack));
		}
		// обычное gi
		else
		{
			trials = 4 * seed->di[i];
			base_count = (seed->di[i] + 3) / 4;
			// потенциальное отступление от СТБ, не влияющее на результат
			if (base_count > priBaseSize())
				base_count = priBaseSize();
			// не удается построить новое простое?
			if (!priExtendPrime(gi + offset, seed->di[i],
				gi + offset + W_OF_B(seed->di[i]), W_OF_B(seed->di[i + 1]),
				trials, base_count, prngSTBStepR, stb_state, stack))
			{
				// к предыдущему простому
				offset += W_OF_B(seed->di[i++]);
				continue;
			}
		}
		// последнее простое?
		if (i == 0)
			break;
		// к следующему простому
		offset -= W_OF_B(seed->di[--i]);
	}
	// сохранить g0
	wwCopy(g0, gi, W_OF_B(seed->di[0]));
	// построить цепочку fi
	while (1)
	{
		for (i = 1; seed->ri[i] > 32; ++i);
		offset = fw - 1;
		while (1)
		{
			// первое (минимальное) fi?
			if (seed->ri[i] <= 32)
			{
				ASSERT(offset == fw - 1);
				do
				{
					prngSTBStepR(fi + offset, O_OF_B(seed->ri[i]), stb_state);
					wwFrom(fi + offset, fi + offset, O_OF_B(seed->ri[i]));
					wwTrimHi(fi + offset, 1, seed->ri[i] - 1);
					wwSetBit(fi + offset, seed->ri[i] - 1, 1);
				}
				while (!priNextPrimeW(fi + offset, fi[offset], stack));
			}
			// обычное fi
			else
			{
				trials = 4 * seed->ri[i];
				base_count = (seed->ri[i] + 3) / 4;
				// потенциальное отступление от СТБ, не влияющее на результат
				if (base_count > priBaseSize())
					base_count = priBaseSize();
				// не удается построить новое простое?
				if (!priExtendPrime(fi + offset, seed->ri[i],
					fi + offset + W_OF_B(seed->ri[i]), W_OF_B(seed->ri[i + 1]),
					trials, base_count, prngSTBStepR, stb_state, stack))
				{
					// к предыдущему простому
					offset += W_OF_B(seed->ri[i++]);
					continue;
				}
			}
			// последнее простое?
			if (i == 0)
				break;
			// к следующему простому
			offset -= W_OF_B(seed->ri[--i]);
		}
		// построить p
		trials = 4 * seed->di[0];
		base_count = (seed->di[0] + 3) / 4;
		if (base_count > priBaseSize())
			base_count = priBaseSize();
		if (priExtendPrime2(p, params->l, g0, W_OF_B(seed->di[0]),
			fi, W_OF_B(seed->ri[0]), trials, base_count,
			prngSTBStepR, stb_state, stack))
			break;

	}
	// сохранить p и q
	wwTo(params->p, no, p);
	wwTo(params->q, mo, fi);
	// построить кольцо Монтгомери
	zmMontCreate(qr, params->p, no, params->l + 2, stack);
	// p <- (p - 1) / q
	zzSubW2(p, n, 1);
	zzDiv(p, a, p, n, gi, m, stack);
	// d <- 5
	memSetZero(params->d, no);
	params->d[0] = 5;
	VERIFY(qrFrom(d, params->d, qr, stack));
	// сгенерировать a
	while (1)
	{
		// a <- d^((p - 1)/q)
		qrPower(a, d, p, n - m + 1, qr, stack);
		// a != e?
		if (!qrIsUnity(a, qr))
			break;
		// d <- d + 1
		zzAddWMod(d, d, 1, qr->mod, n);
	}
	// сохранить a и d
	wwTo(params->a, no, a);
	wwTo(params->d, no, d);
	// все нормально
	blobClose(state);
	return ERR_OK;
}